

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raise.c
# Opt level: O1

int raise(int __sig)

{
  __sighandler_t p_Var1;
  uint uVar2;
  
  uVar2 = __sig - 2;
  if ((uVar2 < 0xe) && ((0x2255U >> (uVar2 & 0x1f) & 1) != 0)) {
    if (*(long *)(&PTR__PDCLIB_sigint_0010dd80)[uVar2] != 1) {
      if (*(long *)(&PTR__PDCLIB_sigint_0010dd80)[uVar2] == 0) goto LAB_001053c4;
      p_Var1 = signal(__sig,(__sighandler_t)0x0);
      (*p_Var1)(__sig);
    }
    return 0;
  }
  raise_cold_1();
LAB_001053c4:
  raise_cold_2();
}

Assistant:

int raise( int sig )
{
    void ( *sighandler )( int );
    const char * message;

    switch ( sig )
    {
        case SIGABRT:
            sighandler = _PDCLIB_sigabrt;
            message = "Abnormal termination (SIGABRT)";
            break;

        case SIGFPE:
            sighandler = _PDCLIB_sigfpe;
            message = "Arithmetic exception (SIGFPE)";
            break;

        case SIGILL:
            sighandler = _PDCLIB_sigill;
            message = "Illegal instruction (SIGILL)";
            break;

        case SIGINT:
            sighandler = _PDCLIB_sigint;
            message = "Interactive attention signal (SIGINT)";
            break;

        case SIGSEGV:
            sighandler = _PDCLIB_sigsegv;
            message = "Invalid memory access (SIGSEGV)";
            break;

        case SIGTERM:
            sighandler = _PDCLIB_sigterm;
            message = "Termination request (SIGTERM)";
            break;

        default:
            fprintf( stderr, "Unknown signal #%d\n", sig );
            _Exit( EXIT_FAILURE );
    }

    if ( sighandler == SIG_DFL )
    {
        fputs( message, stderr );
        _Exit( EXIT_FAILURE );
    }
    else if ( sighandler != SIG_IGN )
    {
        /* FIXME: "The implementation shall behave as if no library function
           calls the signal function."
        */
        sighandler = signal( sig, SIG_DFL );
        sighandler( sig );
    }

    return 0;
}